

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::LazyDescriptor::SetLazy
          (LazyDescriptor *this,string_view name,FileDescriptor *file)

{
  DescriptorPool *pDVar1;
  once_flag *poVar2;
  LazyDescriptor local_30;
  
  if (this->descriptor_ == (Descriptor *)0x0) {
    if (this->once_ != (once_flag *)0x0) goto LAB_001d4f0d;
    if ((file == (FileDescriptor *)0x0) || (pDVar1 = file->pool_, pDVar1 == (DescriptorPool *)0x0))
    {
      SetLazy(&local_30);
      goto LAB_001d4f03;
    }
    if (pDVar1->lazily_build_dependencies_ != false) {
      if (file->finished_building_ != true) {
        poVar2 = (once_flag *)
                 DescriptorPool::Tables::AllocateBytes
                           ((pDVar1->tables_)._M_t.
                            super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            .
                            super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                            ._M_head_impl,(int)name._M_len + 5);
        (poVar2->control_).super___atomic_base<unsigned_int>._M_i = 0;
        this->once_ = poVar2;
        memcpy(poVar2 + 1,name._M_str,name._M_len);
        *(undefined1 *)
         ((long)&poVar2[1].control_.super___atomic_base<unsigned_int>._M_i + name._M_len) = 0;
        return;
      }
      goto LAB_001d4f21;
    }
  }
  else {
LAB_001d4f03:
    SetLazy(&local_30);
LAB_001d4f0d:
    SetLazy(&local_30);
  }
  SetLazy(&local_30);
LAB_001d4f21:
  SetLazy(&local_30);
}

Assistant:

void LazyDescriptor::SetLazy(absl::string_view name,
                             const FileDescriptor* file) {
  // verify Init() has been called and Set hasn't been called yet.
  ABSL_CHECK(!descriptor_);
  ABSL_CHECK(!once_);
  ABSL_CHECK(file && file->pool_);
  ABSL_CHECK(file->pool_->lazily_build_dependencies_);
  ABSL_CHECK(!file->finished_building_);
  once_ = ::new (file->pool_->tables_->AllocateBytes(static_cast<int>(
      sizeof(absl::once_flag) + name.size() + 1))) absl::once_flag{};
  char* lazy_name = reinterpret_cast<char*>(once_ + 1);
  memcpy(lazy_name, name.data(), name.size());
  lazy_name[name.size()] = 0;
}